

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::rehashPowerOfTwo(Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
                   *this,size_t numBuckets)

{
  Node *__ptr;
  uint8_t *puVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  Node *keyval;
  
  uVar4 = this->mMask + 1;
  if (uVar4 < 0x28f5c28f5c28f5d) {
    uVar5 = (uVar4 * 0x50) / 100;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar4 >> 2;
    uVar5 = (SUB168(auVar3 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  __ptr = this->mKeyVals;
  puVar1 = this->mInfo;
  uVar6 = 0xff;
  if (uVar5 < 0xff) {
    uVar6 = uVar5;
  }
  init_data(this,numBuckets);
  if (1 < uVar6 + uVar4) {
    uVar5 = 0;
    keyval = __ptr;
    do {
      if (puVar1[uVar5] != '\0') {
        insert_move(this,keyval);
        puVar2 = (keyval->mData).second.bitmap_owned_data._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        if (puVar2 != (uchar *)0x0) {
          operator_delete__(puVar2);
        }
        (keyval->mData).second.bitmap_owned_data._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
      }
      uVar5 = uVar5 + 1;
      keyval = keyval + 1;
    } while (uVar6 + uVar4 != uVar5);
    if (__ptr != (Node *)&this->mMask) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void rehashPowerOfTwo(size_t numBuckets) {
        ROBIN_HOOD_TRACE(this)

        Node* const oldKeyVals = mKeyVals;
        uint8_t const* const oldInfo = mInfo;

        const size_t oldMaxElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        // resize operation: move stuff
        init_data(numBuckets);
        if (oldMaxElementsWithBuffer > 1) {
            for (size_t i = 0; i < oldMaxElementsWithBuffer; ++i) {
                if (oldInfo[i] != 0) {
                    insert_move(std::move(oldKeyVals[i]));
                    // destroy the node but DON'T destroy the data.
                    oldKeyVals[i].~Node();
                }
            }

            // this check is not necessary as it's guarded by the previous if, but it helps silence
            // g++'s overeager "attempt to free a non-heap object 'map'
            // [-Werror=free-nonheap-object]" warning.
            if (oldKeyVals != reinterpret_cast_no_cast_align_warning<Node*>(&mMask)) {
                // don't destroy old data: put it into the pool instead
                DataPool::addOrFree(oldKeyVals, calcNumBytesTotal(oldMaxElementsWithBuffer));
            }
        }
    }